

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

AMQP_VALUE
create_uamqp_disposition_result_from(AMQP_MESSENGER_DISPOSITION_RESULT disposition_result)

{
  AMQP_VALUE local_18;
  AMQP_VALUE uamqp_disposition_result;
  AMQP_MESSENGER_DISPOSITION_RESULT disposition_result_local;
  
  if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_NONE) {
    local_18 = (AMQP_VALUE)0x0;
  }
  else if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED) {
    local_18 = messaging_delivery_accepted();
  }
  else if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_RELEASED) {
    local_18 = messaging_delivery_released();
  }
  else {
    local_18 = messaging_delivery_rejected("Rejected by application","Rejected by application");
  }
  return local_18;
}

Assistant:

static AMQP_VALUE create_uamqp_disposition_result_from(AMQP_MESSENGER_DISPOSITION_RESULT disposition_result)
{
    AMQP_VALUE uamqp_disposition_result;

    if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_NONE)
    {
        uamqp_disposition_result = NULL; // intentionally not sending an answer.
    }
    else if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED)
    {
        uamqp_disposition_result = messaging_delivery_accepted();
    }
    else if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_RELEASED)
    {
        uamqp_disposition_result = messaging_delivery_released();
    }
    else // id est, if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED)
    {
        uamqp_disposition_result = messaging_delivery_rejected("Rejected by application", "Rejected by application");
    }

    return uamqp_disposition_result;
}